

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O3

void __thiscall
CreditCard::CreditCard(CreditCard *this,double amount,long _number,string *_type,string *_expDate)

{
  Payment::Payment(&this->super_Payment,amount);
  (this->super_Payment)._vptr_Payment = (_func_int **)&PTR__CreditCard_00110c08;
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->expDate)._M_dataplus._M_p = (pointer)&(this->expDate).field_2;
  (this->expDate)._M_string_length = 0;
  (this->expDate).field_2._M_local_buf[0] = '\0';
  this->number = _number;
  std::__cxx11::string::_M_assign((string *)&this->type);
  std::__cxx11::string::_M_assign((string *)&this->expDate);
  return;
}

Assistant:

CreditCard::CreditCard(double amount,long _number,string _type,string _expDate):Payment(amount){
	 number=_number;
	 type=_type;
	 expDate=_expDate;
}